

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O3

size_t bin_read(io_buf *i,char *data,size_t len,char *read_message)

{
  size_t sVar1;
  size_t sVar2;
  vw_exception *this;
  uint32_t obj_len;
  stringstream __msg;
  uint local_1dc;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  sVar1 = io_buf::bin_read_fixed(i,(char *)&local_1dc,4,"");
  if ((3 < sVar1) && (local_1dc <= len)) {
    sVar2 = io_buf::bin_read_fixed(i,data,(ulong)local_1dc,read_message);
    return sVar2 + sVar1;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"bad model format!",0x11);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/io_buf.h"
             ,0x118,&local_1d8);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

inline size_t bin_read(io_buf& i, char* data, size_t len, const char* read_message)
{
  uint32_t obj_len;
  size_t ret = i.bin_read_fixed((char*)&obj_len, sizeof(obj_len), "");
  if (obj_len > len || ret < sizeof(uint32_t))
    THROW("bad model format!");

  ret += i.bin_read_fixed(data, obj_len, read_message);

  return ret;
}